

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::ThrowIfScriptClosed(Func *this)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ScriptContextInfo *pSVar4;
  ScriptContext *this_00;
  undefined4 *puVar5;
  undefined8 uVar6;
  Func *this_local;
  
  pSVar4 = GetScriptContextInfo(this);
  uVar3 = (*pSVar4->_vptr_ScriptContextInfo[0x24])();
  if ((uVar3 & 1) == 0) {
    return;
  }
  bVar2 = IsBackgroundJIT(this);
  if (!bVar2) {
    this_00 = GetScriptContext(this);
    bVar2 = Js::ScriptContext::IsActuallyClosed(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x79c,"(IsBackgroundJIT() || !GetScriptContext()->IsActuallyClosed())",
                         "IsBackgroundJIT() || !GetScriptContext()->IsActuallyClosed()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  uVar6 = __cxa_allocate_exception(1);
  __cxa_throw(uVar6,&Js::OperationAbortedException::typeinfo,0);
}

Assistant:

void Func::ThrowIfScriptClosed()
{
    if (GetScriptContextInfo()->IsClosed())
    {
        // Should not be jitting something in the foreground when the script context is actually closed
        Assert(IsBackgroundJIT() || !GetScriptContext()->IsActuallyClosed());

        throw Js::OperationAbortedException();
    }
}